

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O0

Block * __thiscall Sealer::Upchain(Block *__return_storage_ptr__,Sealer *this,Blockchain *bc)

{
  Blockchain *this_00;
  size_t sVar1;
  Block local_1b0;
  Block local_118;
  string local_80 [55];
  allocator local_49;
  string local_48 [39];
  undefined1 local_21;
  Blockchain *local_20;
  Blockchain *bc_local;
  Sealer *this_local;
  Block *bNew;
  
  local_21 = 0;
  local_20 = bc;
  bc_local = (Blockchain *)this;
  this_local = (Sealer *)__return_storage_ptr__;
  sVar1 = Blockchain::GetBlockIndex(bc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,anon_var_dwarf_21f85 + 0xc,&local_49);
  std::__cxx11::string::string(local_80,(string *)&this->merkle_root);
  Block::Block(__return_storage_ptr__,(uint32_t)sVar1,(string *)local_48,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  this_00 = local_20;
  Block::Block(&local_1b0,__return_storage_ptr__);
  Blockchain::AddBlock(&local_118,this_00,&local_1b0);
  Block::operator=(__return_storage_ptr__,&local_118);
  Block::~Block(&local_118);
  Block::~Block(&local_1b0);
  Blockchain::BlockIndexAdd(local_20);
  return __return_storage_ptr__;
}

Assistant:

Block Sealer::Upchain(Blockchain & bc) {
        Block bNew = Block(bc.GetBlockIndex(),"",merkle_root);
        bNew = bc.AddBlock(bNew);
        bc.BlockIndexAdd();
        return bNew;
}